

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlParserCtxtPtr htmlCreateFileParserCtxt(char *filename,char *encoding)

{
  xmlMallocFunc p_Var1;
  int iVar2;
  xmlChar *pxVar3;
  xmlParserInputPtr value;
  size_t sVar4;
  size_t l;
  xmlChar *content_line;
  xmlChar *content;
  char *canonicFilename;
  htmlParserInputPtr inputStream;
  htmlParserCtxtPtr ctxt;
  char *encoding_local;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)htmlNewParserCtxt();
    if ((htmlParserCtxtPtr)filename_local == (htmlParserCtxtPtr)0x0) {
      filename_local = (char *)0x0;
    }
    else {
      pxVar3 = xmlCanonicPath((xmlChar *)filename);
      if (pxVar3 == (xmlChar *)0x0) {
        xmlFreeParserCtxt((xmlParserCtxtPtr)filename_local);
        filename_local = (char *)0x0;
      }
      else {
        value = xmlLoadExternalEntity((char *)pxVar3,(char *)0x0,(xmlParserCtxtPtr)filename_local);
        (*xmlFree)(pxVar3);
        if (value == (xmlParserInputPtr)0x0) {
          xmlFreeParserCtxt((xmlParserCtxtPtr)filename_local);
          filename_local = (char *)0x0;
        }
        else {
          inputPush((xmlParserCtxtPtr)filename_local,value);
          if ((encoding != (char *)0x0) &&
             (sVar4 = strlen(encoding), p_Var1 = xmlMallocAtomic, sVar4 < 1000)) {
            iVar2 = xmlStrlen("charset=");
            pxVar3 = (xmlChar *)(*p_Var1)((long)iVar2 + sVar4 + 1);
            if (pxVar3 != (xmlChar *)0x0) {
              strcpy((char *)pxVar3,"charset=");
              strcat((char *)pxVar3,encoding);
              htmlCheckEncoding((htmlParserCtxtPtr)filename_local,pxVar3);
              (*xmlFree)(pxVar3);
            }
          }
        }
      }
    }
  }
  return (htmlParserCtxtPtr)filename_local;
}

Assistant:

htmlParserCtxtPtr
htmlCreateFileParserCtxt(const char *filename, const char *encoding)
{
    htmlParserCtxtPtr ctxt;
    htmlParserInputPtr inputStream;
    char *canonicFilename;
    /* htmlCharEncoding enc; */
    xmlChar *content, *content_line = (xmlChar *) "charset=";

    if (filename == NULL)
        return(NULL);

    ctxt = htmlNewParserCtxt();
    if (ctxt == NULL) {
	return(NULL);
    }
    canonicFilename = (char *) xmlCanonicPath((const xmlChar *) filename);
    if (canonicFilename == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputStream = xmlLoadExternalEntity(canonicFilename, NULL, ctxt);
    xmlFree(canonicFilename);
    if (inputStream == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputPush(ctxt, inputStream);

    /* set encoding */
    if (encoding) {
        size_t l = strlen(encoding);

	if (l < 1000) {
	    content = xmlMallocAtomic (xmlStrlen(content_line) + l + 1);
	    if (content) {
		strcpy ((char *)content, (char *)content_line);
		strcat ((char *)content, (char *)encoding);
		htmlCheckEncoding (ctxt, content);
		xmlFree (content);
	    }
	}
    }

    return(ctxt);
}